

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readSequence.hpp
# Opt level: O2

vector<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>_>_>
* __thiscall
njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::
readSequence<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (vector<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>_>_>
           *__return_storage_ptr__,DiscreteTwoBodyScattering *this,long nep,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  undefined4 in_stack_ffffffffffffff2c;
  ListRecord list;
  TabulatedDistribution local_78;
  
  (__return_storage_ptr__->
  super__Vector_base<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>_>_>
  ::reserve(__return_storage_ptr__,(size_type)this);
  do {
    bVar2 = this == (DiscreteTwoBodyScattering *)0x0;
    this = (DiscreteTwoBodyScattering *)
           ((long)&this[-1].data_.sequence_.
                   super__Vector_base<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    if (bVar2) {
      return __return_storage_ptr__;
    }
    iVar3 = MF;
    ListRecord::ListRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (&list,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)nep,begin,(long *)end,(int)lineNumber,MAT,MF);
    if (list.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
        super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
        super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
        _M_head_impl == 0) {
      LegendreCoefficients::LegendreCoefficients((LegendreCoefficients *)&local_78,&list);
      std::
      vector<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>_>_>
      ::
      emplace_back<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients>
                (__return_storage_ptr__,(LegendreCoefficients *)&local_78);
    }
    else {
      if ((list.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
           super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
           super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
           _M_head_impl != 0xc) &&
         (list.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
          super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
          _M_head_impl != 0xe)) {
        tools::Log::error<char_const*>((char *)CONCAT44(in_stack_ffffffffffffff2c,iVar3));
        tools::Log::info<char_const*>((char *)CONCAT44(in_stack_ffffffffffffff2c,iVar3));
        tools::Log::info<char_const*,long>
                  ("LANG value: {}",
                   list.metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>
                   ._M_head_impl);
        tools::Log::info<char_const*,long>
                  ("Line number: {}",
                   (long)(end->_M_current +
                         ~((((long)list.data.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)list.data.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3) + 5) / 6)));
        puVar1 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar1 = getenv;
        __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
      }
      TabulatedDistribution::TabulatedDistribution(&local_78,&list);
      std::
      vector<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>_>_>
      ::
      emplace_back<njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution>
                (__return_storage_ptr__,&local_78);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_78.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&list.data.super__Vector_base<double,_std::allocator<double>_>);
  } while( true );
}

Assistant:

static std::vector< Variant >
readSequence( long nep,
              Iterator& begin,
              const Iterator& end,
              long& lineNumber,
              int MAT,
              int MF,
              int MT ) {

  std::vector< Variant > sequence;
  sequence.reserve( nep );

  while( nep-- ) {

    ListRecord list( begin, end, lineNumber, MAT, MF, MT );
    switch ( list.L1() ) {

      case 0 : sequence.emplace_back(
                  LegendreCoefficients( std::move( list ) ) );
                  break;
      case 12 :
      case 14 : sequence.emplace_back(
                  TabulatedDistribution( std::move( list ) ) );
                  break;
      default : {

        Log::error( "Encountered illegal LANG value" );
        Log::info( "LANG must be equal to 0, 12 or 14" );
        Log::info( "LANG value: {}", list.L1() );
        Log::info( "Line number: {}", lineNumber - list.NC() );
        throw std::exception();
      }
    }
  }

  return sequence;
}